

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Catch::Generators::
makeGenerators<std::__cxx11::string,char_const(&)[6],char_const(&)[4],char_const(&)[6],char_const(&)[4]>
          (Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Generators *this,char (*param_3) [6],char (*param_4) [4],
          char (*param_5) [6],char (*param_6) [4])

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  GeneratorWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char (*local_38) [6];
  char (*moreGenerators_local_2) [4];
  char (*moreGenerators_local_1) [6];
  char (*moreGenerators_local) [4];
  char (*val_local) [6];
  Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_38 = param_5;
  moreGenerators_local_2 = param_4;
  moreGenerators_local_1 = param_3;
  moreGenerators_local = (char (*) [4])this;
  local_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,(char *)this,&local_61);
  value<std::__cxx11::string>((Generators *)&local_40,&local_60);
  makeGenerators<std::__cxx11::string,char_const(&)[4],char_const(&)[6],char_const(&)[4]>
            (__return_storage_ptr__,(Generators *)&local_40,
             (GeneratorWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)moreGenerators_local_1,moreGenerators_local_2,local_38,param_6);
  GeneratorWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~GeneratorWrapper(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( as<T>, U&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( T( std::forward<U>( val ) ) ), std::forward<Gs>( moreGenerators )... );
    }